

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_localize_ghost_int(REF_NODE ref_node,REF_INT *scalar)

{
  size_t __size;
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  REF_INT *send_size;
  long lVar6;
  REF_INT *recv_size;
  void *pvVar7;
  void *recv;
  void *recv_00;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  REF_INT local;
  int local_54;
  ulong local_50;
  undefined1 local_48 [16];
  undefined4 *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar4 = ref_mpi->n;
  if ((long)(int)uVar4 < 2) {
    return 0;
  }
  __size = (long)(int)uVar4 * 4;
  send_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_0020e360;
  if (send_size == (REF_INT *)0x0) {
    pcVar11 = "malloc a_size of REF_INT NULL";
    uVar10 = 0x4c8;
    goto LAB_00137504;
  }
  lVar6 = (ulong)uVar4 - 1;
  auVar16._8_4_ = (int)lVar6;
  auVar16._0_8_ = lVar6;
  auVar16._12_4_ = (int)((ulong)lVar6 >> 0x20);
  lVar6 = 0;
  local_48 = auVar16 ^ _DAT_0020e360;
  auVar17 = _DAT_0020e340;
  auVar14 = _DAT_0020e350;
  do {
    auVar16 = auVar14 ^ auVar3;
    iVar8 = local_48._4_4_;
    if ((bool)(~(auVar16._4_4_ == iVar8 && local_48._0_4_ < auVar16._0_4_ || iVar8 < auVar16._4_4_)
              & 1)) {
      *(undefined4 *)((long)send_size + lVar6) = 0;
    }
    if ((auVar16._12_4_ != local_48._12_4_ || auVar16._8_4_ <= local_48._8_4_) &&
        auVar16._12_4_ <= local_48._12_4_) {
      *(undefined4 *)((long)send_size + lVar6 + 4) = 0;
    }
    auVar16 = auVar17 ^ auVar3;
    iVar18 = auVar16._4_4_;
    if (iVar18 <= iVar8 && (iVar18 != iVar8 || auVar16._0_4_ <= local_48._0_4_)) {
      *(undefined4 *)((long)send_size + lVar6 + 8) = 0;
      *(undefined4 *)((long)send_size + lVar6 + 0xc) = 0;
    }
    lVar9 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 4;
    auVar14._8_8_ = lVar9 + 4;
    lVar9 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 4;
    auVar17._8_8_ = lVar9 + 4;
    lVar6 = lVar6 + 0x10;
  } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar6);
  recv_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_0020e360;
  if (recv_size == (REF_INT *)0x0) {
    pcVar11 = "malloc b_size of REF_INT NULL";
    uVar10 = 0x4c9;
    goto LAB_00137504;
  }
  lVar6 = 0;
  auVar13 = _DAT_0020e340;
  auVar15 = _DAT_0020e350;
  do {
    auVar17 = auVar15 ^ auVar3;
    if ((bool)(~(auVar17._4_4_ == local_48._4_4_ && (int)local_48._0_4_ < auVar17._0_4_ ||
                (int)local_48._4_4_ < auVar17._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size + lVar6) = 0;
    }
    if ((auVar17._12_4_ != local_48._12_4_ || auVar17._8_4_ <= (int)local_48._8_4_) &&
        auVar17._12_4_ <= (int)local_48._12_4_) {
      *(undefined4 *)((long)recv_size + lVar6 + 4) = 0;
    }
    auVar17 = auVar13 ^ auVar3;
    iVar8 = auVar17._4_4_;
    if (iVar8 <= (int)local_48._4_4_ &&
        (iVar8 != local_48._4_4_ || auVar17._0_4_ <= (int)local_48._0_4_)) {
      *(undefined4 *)((long)recv_size + lVar6 + 8) = 0;
      *(undefined4 *)((long)recv_size + lVar6 + 0xc) = 0;
    }
    lVar9 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 4;
    auVar15._8_8_ = lVar9 + 4;
    lVar9 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 4;
    auVar13._8_8_ = lVar9 + 4;
    lVar6 = lVar6 + 0x10;
  } while ((ulong)(uVar4 + 3 >> 2) << 4 != lVar6);
  iVar8 = ref_node->max;
  if (0 < (long)iVar8) {
    pRVar2 = ref_node->global;
    lVar6 = 0;
    do {
      if ((-1 < pRVar2[lVar6]) && (ref_mpi->id != ref_node->part[lVar6])) {
        send_size[ref_node->part[lVar6]] = send_size[ref_node->part[lVar6]] + 1;
      }
      lVar6 = lVar6 + 1;
    } while (iVar8 != lVar6);
  }
  uVar4 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar4 != 0) {
    pcVar11 = "alltoall sizes";
    uVar10 = 0x4d2;
LAB_001374b4:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10,
           "ref_node_localize_ghost_int",(ulong)uVar4,pcVar11);
    return uVar4;
  }
  uVar4 = ref_mpi->n;
  lVar6 = (long)(int)uVar4;
  if (lVar6 < 1) {
    uVar5 = 0;
  }
  else {
    lVar9 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + send_size[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
    if ((int)uVar5 < 0) {
      pcVar11 = "malloc a_global of REF_GLOB negative";
      uVar10 = 0x4d6;
      goto LAB_001377be;
    }
  }
  pvVar7 = malloc((ulong)uVar5 * 8);
  if (pvVar7 == (void *)0x0) {
    pcVar11 = "malloc a_global of REF_GLOB NULL";
    uVar10 = 0x4d6;
  }
  else {
    local_48._0_8_ = pvVar7;
    pvVar7 = malloc((ulong)uVar5 << 2);
    if (pvVar7 == (void *)0x0) {
      pcVar11 = "malloc a_scalar of REF_INT NULL";
      uVar10 = 0x4d7;
      goto LAB_00137504;
    }
    if ((int)uVar4 < 1) {
      uVar5 = 0;
    }
    else {
      lVar9 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 + recv_size[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar6 != lVar9);
      if ((int)uVar5 < 0) {
        pcVar11 = "malloc b_global of REF_GLOB negative";
        uVar10 = 0x4db;
        goto LAB_001377be;
      }
    }
    uVar12 = (ulong)uVar5;
    recv = malloc(uVar12 * 8);
    if (recv == (void *)0x0) {
      pcVar11 = "malloc b_global of REF_GLOB NULL";
      uVar10 = 0x4db;
    }
    else {
      local_50 = uVar12;
      recv_00 = malloc(uVar12 * 4);
      if (recv_00 == (void *)0x0) {
        pcVar11 = "malloc b_scalar of REF_INT NULL";
        uVar10 = 0x4dc;
      }
      else {
        if ((int)uVar4 < 0) {
          pcVar11 = "malloc a_next of REF_INT negative";
          uVar10 = 0x4de;
LAB_001377be:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 uVar10,"ref_node_localize_ghost_int",pcVar11);
          return 1;
        }
        local_38 = (undefined4 *)malloc(lVar6 * 4);
        if (local_38 != (undefined4 *)0x0) {
          *local_38 = 0;
          if (1 < uVar4) {
            lVar9 = 0;
            iVar8 = 0;
            do {
              iVar8 = iVar8 + send_size[lVar9];
              local_38[lVar9 + 1] = iVar8;
              lVar9 = lVar9 + 1;
            } while (lVar6 + -1 != lVar9);
          }
          iVar8 = ref_node->max;
          if (0 < (long)iVar8) {
            pRVar2 = ref_node->global;
            lVar6 = 0;
            do {
              if ((-1 < pRVar2[lVar6]) &&
                 (iVar18 = ref_node->part[lVar6], ref_node->ref_mpi->id != iVar18)) {
                iVar1 = local_38[iVar18];
                *(REF_GLOB *)(local_48._0_8_ + (long)iVar1 * 8) = pRVar2[lVar6];
                *(REF_INT *)((long)pvVar7 + (long)iVar1 * 4) = scalar[lVar6];
                local_38[iVar18] = iVar1 + 1;
              }
              lVar6 = lVar6 + 1;
            } while (iVar8 != lVar6);
          }
          uVar4 = ref_mpi_alltoallv(ref_mpi,(void *)local_48._0_8_,send_size,recv,recv_size,1,2);
          if (uVar4 == 0) {
            uVar4 = ref_mpi_alltoallv(ref_mpi,pvVar7,send_size,recv_00,recv_size,1,1);
            if (uVar4 == 0) {
              if (local_50 != 0) {
                uVar12 = 0;
                do {
                  uVar4 = ref_node_local(ref_node,*(REF_GLOB *)((long)recv + uVar12 * 8),&local_54);
                  if (uVar4 != 0) {
                    pcVar11 = "g2l";
                    uVar10 = 0x4f6;
                    goto LAB_001374b4;
                  }
                  scalar[local_54] = scalar[local_54] + *(int *)((long)recv_00 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (local_50 != uVar12);
              }
              iVar8 = ref_node->max;
              if (0 < iVar8) {
                pRVar2 = ref_node->global;
                lVar6 = 0;
                do {
                  if ((-1 < pRVar2[lVar6]) && (ref_node->ref_mpi->id != ref_node->part[lVar6])) {
                    scalar[lVar6] = 0;
                    iVar8 = ref_node->max;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < iVar8);
              }
              free(local_38);
              free(recv_00);
              free(recv);
              free(pvVar7);
              free((void *)local_48._0_8_);
              free(recv_size);
              free(send_size);
              return 0;
            }
            pcVar11 = "alltoallv scalar";
            uVar10 = 0x4f3;
          }
          else {
            pcVar11 = "alltoallv global";
            uVar10 = 0x4ef;
          }
          goto LAB_001374b4;
        }
        pcVar11 = "malloc a_next of REF_INT NULL";
        uVar10 = 0x4de;
      }
    }
  }
LAB_00137504:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar10,
         "ref_node_localize_ghost_int",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_localize_ghost_int(REF_NODE ref_node,
                                               REF_INT *scalar) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_INT *a_scalar, *b_scalar;
  REF_INT local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);
  ref_malloc(a_scalar, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);
  ref_malloc(b_scalar, b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_scalar[a_next[part]] = scalar[node];
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  RSS(ref_mpi_alltoallv(ref_mpi, a_scalar, a_size, b_scalar, b_size, 1,
                        REF_INT_TYPE),
      "alltoallv scalar");

  for (node = 0; node < b_total; node++) {
    RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
    scalar[local] += b_scalar[node];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      scalar[node] = 0;
    }
  }

  free(a_next);
  free(b_scalar);
  free(b_global);
  free(a_scalar);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}